

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeVLDST4Instruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  bool bVar1;
  DecodeStatus DVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint16_t *Decoder_00;
  uint64_t extraout_RDX;
  uint64_t uVar6;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint uVar7;
  long lVar8;
  
  if ((~Insn & 0xc0) == 0) {
    return MCDisassembler_Fail;
  }
  if ((Insn >> 0x15 & 1) == 0) {
    DVar2 = DecodeVSTInstruction(Inst,Insn,Address,Decoder);
    return DVar2;
  }
  uVar7 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  uVar3 = MCInst_getOpcode(Inst);
  if (uVar3 - 0x391 < 0xc) {
LAB_00155c34:
    lVar8 = 0;
    if (uVar7 != 0x1f) {
      MCOperand_CreateReg0(Inst,(uint)DPairDecoderTable[uVar7]);
      lVar8 = 3;
    }
    DVar2 = (*(code *)((long)&DAT_001d4a10 + (long)(int)(&DAT_001d4a10)[lVar8]))();
    return DVar2;
  }
  if (uVar3 - 0x3d2 < 9) {
    lVar8 = 0;
    if (uVar7 < 0x1e) {
      MCOperand_CreateReg0(Inst,(uint)DPairSpacedDecoderTable[uVar7]);
      lVar8 = 3;
    }
    DVar2 = (*(code *)((long)&DAT_001d4a00 + (long)(int)(&DAT_001d4a00)[lVar8]))();
    return DVar2;
  }
  if (uVar3 - 0x3db < 9) goto LAB_00155c34;
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar7]);
  uVar4 = MCInst_getOpcode(Inst);
  iVar5 = 1;
  uVar3 = uVar4 - 0x43d;
  if (uVar3 < 0x22) {
    if ((0x999UL >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)uVar3 & 0x3f) & 1) == 0) goto LAB_00155ceb;
LAB_00155d10:
      iVar5 = 2;
    }
LAB_00155d15:
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[iVar5 + uVar7 & 0x1f]);
  }
  else {
LAB_00155ceb:
    uVar4 = uVar4 - 0x4b1;
    if (uVar4 < 0x22) {
      if ((0x999UL >> ((ulong)uVar4 & 0x3f) & 1) != 0) goto LAB_00155d15;
      if ((0x294a00000U >> ((ulong)uVar4 & 0x3f) & 1) != 0) goto LAB_00155d10;
    }
  }
  uVar4 = MCInst_getOpcode(Inst);
  Decoder_00 = (uint16_t *)0x2;
  uVar3 = uVar4 - 0x43d;
  if (uVar3 < 0x22) {
    if ((0x999UL >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)uVar3 & 0x3f) & 1) == 0) goto LAB_00155d68;
LAB_00155d8d:
      Decoder_00 = (uint16_t *)0x4;
    }
LAB_00155d92:
    Decoder_00 = (uint16_t *)(ulong)((int)Decoder_00 + uVar7 & 0x1f);
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[(long)Decoder_00]);
  }
  else {
LAB_00155d68:
    uVar4 = uVar4 - 0x4b1;
    if (uVar4 < 0x22) {
      if ((0x999UL >> ((ulong)uVar4 & 0x3f) & 1) != 0) goto LAB_00155d92;
      Decoder_00 = (uint16_t *)0x294a00000;
      if ((0x294a00000U >> ((ulong)uVar4 & 0x3f) & 1) != 0) goto LAB_00155d8d;
    }
  }
  uVar4 = Insn >> 0x10 & 0xf;
  uVar3 = MCInst_getOpcode(Inst);
  uVar3 = uVar3 - 0x4b1;
  if (uVar3 < 0x22) {
    Decoder_00 = (uint16_t *)0x3;
    if ((0x999UL >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      Decoder_00 = (uint16_t *)0x294a00000;
      if ((0x294a00000U >> ((ulong)uVar3 & 0x3f) & 1) == 0) goto LAB_00155e08;
      Decoder_00 = (uint16_t *)0x6;
    }
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar7 + (int)Decoder_00 & 0x1f]);
  }
LAB_00155e08:
  uVar3 = MCInst_getOpcode(Inst);
  uVar6 = extraout_RDX;
  if ((int)uVar3 < 0x3d3) {
    if ((uVar3 - 0x369 < 0x34) &&
       (Decoder_00 = (uint16_t *)0xdb6f67860f67b,
       (0xdb6f67860f67bU >> ((ulong)(uVar3 - 0x369) & 0x3f) & 1) != 0)) {
LAB_00155e59:
      MCOperand_CreateImm0(Inst,0);
      uVar6 = extraout_RDX_00;
    }
  }
  else {
    Decoder_00 = (uint16_t *)(ulong)(uVar3 - 0x3d3);
    if ((uVar3 - 0x3d3 < 0x23) &&
       (uVar6 = 0x61861b6db, (0x61861b6dbU >> ((ulong)Decoder_00 & 0x3f) & 1) != 0))
    goto LAB_00155e59;
    uVar7 = uVar3 - 0x440;
    Decoder_00 = (uint16_t *)(ulong)uVar7;
    if (((uVar7 < 0x1f) && (uVar6 = 0x42100111, (0x42100111U >> (uVar7 & 0x1f) & 1) != 0)) ||
       ((uVar3 - 0x4b4 < 0x1f &&
        (Decoder_00 = (uint16_t *)0x42100111, (0x42100111U >> (uVar3 - 0x4b4 & 0x1f) & 1) != 0)))) {
      Decoder_00 = GPRDecoderTable;
      MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar4]);
      uVar6 = extraout_RDX_01;
    }
  }
  DVar2 = DecodeAddrMode6Operand(Inst,Insn & 0x30 | uVar4,uVar6,Decoder_00);
  if (DVar2 == MCDisassembler_Fail) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 == MCDisassembler_SoftFail) goto LAB_00155e8c;
      bVar1 = false;
    }
    DVar2 = MCDisassembler_Success;
  }
LAB_00155e8c:
  if (!bVar1) {
    return MCDisassembler_Fail;
  }
  uVar3 = MCInst_getOpcode(Inst);
  if ((0x33 < uVar3 - 0x369) || ((0xdb6d26820d269U >> ((ulong)(uVar3 - 0x369) & 0x3f) & 1) == 0)) {
    if ((uVar3 - 0x3d3 < 0x22) && ((0x208209249U >> ((ulong)(uVar3 - 0x3d3) & 0x3f) & 1) != 0)) {
      return DVar2;
    }
    uVar3 = 0;
    if ((Insn & 0xf) == 0xd) goto LAB_00155ed0;
  }
  if ((~Insn & 0xd) == 0) {
    return DVar2;
  }
  uVar3 = (uint)GPRDecoderTable[Insn & 0xf];
LAB_00155ed0:
  MCOperand_CreateReg0(Inst,uVar3);
  return DVar2;
}

Assistant:

static DecodeStatus DecodeVLDST4Instruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	unsigned load;
	unsigned size = fieldFromInstruction_4(Insn, 6, 2);
	if (size == 3) return MCDisassembler_Fail;

	load = fieldFromInstruction_4(Insn, 21, 1);
	return load ? DecodeVLDInstruction(Inst, Insn, Address, Decoder)
		: DecodeVSTInstruction(Inst, Insn, Address, Decoder);
}